

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t float128_to_int64_sparc(float128 a,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  int64_t iVar1;
  uint64_t local_48;
  uint64_t aSig1;
  uint64_t aSig0;
  int local_30;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  local_48 = extractFloat128Frac1(a);
  a_00.high = a_local.low;
  a_00.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(a_00);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  local_30 = extractFloat128Exp(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  shiftCount._3_1_ = extractFloat128Sign(a_02);
  if (local_30 != 0) {
    aSig1 = aSig1 | 0x1000000000000;
  }
  aSig0._4_4_ = 0x402f - local_30;
  if (aSig0._4_4_ < 1) {
    if (0x403e < local_30) {
      float_raise_sparc('\x01',_aExp);
      if ((shiftCount._3_1_ != '\0') &&
         ((local_30 != 0x7fff || ((local_48 == 0 && (aSig1 == 0x1000000000000)))))) {
        return -0x8000000000000000;
      }
      return 0x7fffffffffffffff;
    }
    shortShift128Left(aSig1,local_48,-aSig0._4_4_,&aSig1,&local_48);
  }
  else {
    shift64ExtraRightJamming(aSig1,local_48,aSig0._4_4_,&aSig1,&local_48);
  }
  iVar1 = roundAndPackInt64(shiftCount._3_1_,aSig1,local_48,_aExp);
  return iVar1;
}

Assistant:

int64_t float128_to_int64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    if ( shiftCount <= 0 ) {
        if ( 0x403E < aExp ) {
            float_raise(float_flag_invalid, status);
            if (    ! aSign
                 || (    ( aExp == 0x7FFF )
                      && ( aSig1 || ( aSig0 != UINT64_C(0x0001000000000000) ) )
                    )
               ) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        shortShift128Left( aSig0, aSig1, - shiftCount, &aSig0, &aSig1 );
    }
    else {
        shift64ExtraRightJamming( aSig0, aSig1, shiftCount, &aSig0, &aSig1 );
    }
    return roundAndPackInt64(aSign, aSig0, aSig1, status);

}